

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerators::cmQtAutoGenerators(cmQtAutoGenerators *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_41;
  undefined1 local_40 [8];
  string colorEnv;
  cmQtAutoGenerators *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->Sources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RccSources);
  std::__cxx11::string::string((string *)&this->SkipMoc);
  std::__cxx11::string::string((string *)&this->SkipUic);
  std::__cxx11::string::string((string *)&this->Headers);
  std::__cxx11::string::string((string *)&this->Srcdir);
  std::__cxx11::string::string((string *)&this->Builddir);
  std::__cxx11::string::string((string *)&this->MocExecutable);
  std::__cxx11::string::string((string *)&this->UicExecutable);
  std::__cxx11::string::string((string *)&this->RccExecutable);
  std::__cxx11::string::string((string *)&this->MocCompileDefinitionsStr);
  std::__cxx11::string::string((string *)&this->MocIncludesStr);
  std::__cxx11::string::string((string *)&this->MocOptionsStr);
  std::__cxx11::string::string((string *)&this->ProjectBinaryDir);
  std::__cxx11::string::string((string *)&this->ProjectSourceDir);
  std::__cxx11::string::string((string *)&this->TargetName);
  std::__cxx11::string::string((string *)&this->OriginTargetName);
  std::__cxx11::string::string((string *)&this->CurrentCompileSettingsStr);
  std::__cxx11::string::string((string *)&this->OldCompileSettingsStr);
  std::__cxx11::string::string((string *)&this->OutMocCppFilename);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->MocIncludes);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->MocDefinitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MocOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->UicTargetOptions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->UicOptions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->RccOptions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->RccInputs);
  pcVar2 = cmsys::SystemTools::GetEnv("VERBOSE");
  this->Verbose = pcVar2 != (char *)0x0;
  this->ColorOutput = true;
  this->RunMocFailed = false;
  this->RunUicFailed = false;
  this->RunRccFailed = false;
  this->GenerateAll = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cmsys::SystemTools::GetEnv("COLOR",(string *)local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::IsOn(pcVar2);
    if (bVar1) {
      this->ColorOutput = true;
    }
    else {
      this->ColorOutput = false;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

cmQtAutoGenerators::cmQtAutoGenerators()
:Verbose(cmsys::SystemTools::GetEnv("VERBOSE") != 0)
,ColorOutput(true)
,RunMocFailed(false)
,RunUicFailed(false)
,RunRccFailed(false)
,GenerateAll(false)
{

  std::string colorEnv = "";
  cmsys::SystemTools::GetEnv("COLOR", colorEnv);
  if(!colorEnv.empty())
    {
    if(cmSystemTools::IsOn(colorEnv.c_str()))
      {
      this->ColorOutput = true;
      }
    else
      {
      this->ColorOutput = false;
      }
    }
}